

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::V1LayerParameter::V1LayerParameter(V1LayerParameter *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__V1LayerParameter_006fb070;
  memset(&this->_internal_metadata_,0,0xe0);
  if (this != (V1LayerParameter *)&_V1LayerParameter_default_instance_) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  (this->name_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  memset(&this->layer_,0,0x100);
  return;
}

Assistant:

V1LayerParameter::V1LayerParameter()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.V1LayerParameter)
}